

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::tab_r::ndf_std_radial(tab_r *this,float_t zm)

{
  size_type sVar1;
  float_t fVar2;
  double dVar3;
  float_t u;
  float_t zm_local;
  tab_r *this_local;
  
  if (zm < 0.0) {
    this_local._4_4_ = 0.0;
  }
  else {
    dVar3 = std::acos((double)(ulong)(uint)zm);
    fVar2 = m_pi();
    dVar3 = std::sqrt((double)(ulong)(uint)(SUB84(dVar3,0) * (2.0 / fVar2)));
    sVar1 = std::vector<float,_std::allocator<float>_>::size(&this->m_ndf);
    this_local._4_4_ =
         spline::eval<float>(&this->m_ndf,(int)sVar1,spline::uwrap_edge,SUB84(dVar3,0));
  }
  return this_local._4_4_;
}

Assistant:

float_t tab_r::ndf_std_radial(float_t zm) const
{
	if (zm >= 0) {
		float_t u = sqrt(acos(zm) * (2 / m_pi()));
		return spline::eval(m_ndf, (int)m_ndf.size(), spline::uwrap_edge, u);
	}

	return 0;
}